

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_string.c
# Opt level: O0

void d_string_insert_c(DString *baseString,size_t pos,char insertedCharacter)

{
  size_t newSizeNeeded;
  size_t sStack_18;
  char insertedCharacter_local;
  size_t pos_local;
  DString *baseString_local;
  
  if ((baseString != (DString *)0x0) && (insertedCharacter != '\0')) {
    sStack_18 = pos;
    if (baseString->currentStringLength < pos) {
      sStack_18 = baseString->currentStringLength;
    }
    ensureStringBufferCanHold(baseString,baseString->currentStringLength + 1);
    memmove(baseString->str + sStack_18 + 1,baseString->str + sStack_18,
            baseString->currentStringLength - sStack_18);
    baseString->str[sStack_18] = insertedCharacter;
    baseString->currentStringLength = baseString->currentStringLength + 1;
    baseString->str[baseString->currentStringLength] = '\0';
  }
  return;
}

Assistant:

void d_string_insert_c(DString * baseString, size_t pos, char insertedCharacter) {
	if (baseString && insertedCharacter) {
		if (pos > baseString->currentStringLength) {
			pos = baseString->currentStringLength;
		}

		size_t newSizeNeeded = baseString->currentStringLength + 1;
		ensureStringBufferCanHold(baseString, newSizeNeeded);

		/* Shift following string to 'right' */
		memmove(baseString->str + pos + 1, baseString->str + pos, baseString->currentStringLength - pos);

		baseString->str[pos] = insertedCharacter;
		baseString->currentStringLength++;
		baseString->str[baseString->currentStringLength] = '\0';
	}
}